

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O1

void __thiscall
embree::avx::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::avx::RecalculatePrimRef<embree::Instance>,_2UL>
::TemporalBinInfo::bin
          (TemporalBinInfo *this,PrimRefMB *prims,size_t begin,size_t end,BBox1f time_range,
          SetMB *set,RecalculatePrimRef<embree::Instance> *recalculatePrimRef)

{
  BBox1f BVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Instance *pIVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  float fVar7;
  float *pfVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar12 [64];
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  undefined1 auVar20 [64];
  undefined1 in_register_000013c4 [12];
  LBBox3fa bn0;
  BBox1f local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  auVar12._8_56_ = in_register_00001208;
  auVar12._0_8_ = time_range;
  local_a8 = auVar12._0_16_;
  auVar20 = ZEXT1664(local_a8);
  local_c8 = vmovshdup_avx(local_a8);
  fVar19 = (set->super_PrimInfoMB).max_time_range.lower;
  fVar7 = (set->super_PrimInfoMB).max_time_range.upper - fVar19;
  fVar18 = (float)(set->super_PrimInfoMB).max_num_time_segments;
  fVar13 = (((time_range.lower * 0.5 + local_c8._0_4_ * 0.5) - fVar19) / fVar7) * fVar18;
  auVar17._8_4_ = 0x80000000;
  auVar17._0_8_ = 0x8000000080000000;
  auVar17._12_4_ = 0x80000000;
  auVar17 = vandps_avx(ZEXT416((uint)fVar13),auVar17);
  auVar15._8_4_ = 0x3effffff;
  auVar15._0_8_ = 0x3effffff3effffff;
  auVar15._12_4_ = 0x3effffff;
  auVar17 = vorps_avx(auVar17,auVar15);
  auVar17 = ZEXT416((uint)(fVar13 + auVar17._0_4_));
  auVar17 = vroundss_avx(auVar17,auVar17,0xb);
  fVar19 = (auVar17._0_4_ / fVar18) * fVar7 + fVar19;
  if (((time_range.lower < fVar19) && (fVar19 < local_c8._0_4_)) &&
     (lVar9 = end - begin, begin <= end && lVar9 != 0)) {
    local_b8 = ZEXT416((uint)fVar19);
    local_48 = vinsertps_avx(local_a8,local_b8,0x10);
    local_58._4_12_ = auVar12._4_12_;
    local_58._0_4_ = fVar19;
    pfVar8 = &prims[begin].time_range.upper;
    do {
      if ((auVar20._0_4_ < *pfVar8 * 0.9999) && (((BBox1f *)(pfVar8 + -1))->lower * 1.0001 < fVar19)
         ) {
        local_d0 = (BBox1f)vmovlps_avx(local_48);
        pIVar5 = (Instance *)(recalculatePrimRef->scene->geometries).items[(uint)pfVar8[-0xe]].ptr;
        Instance::nonlinearBounds
                  ((LBBox3fa *)&local_98.field_1,pIVar5,&local_d0,
                   &(pIVar5->super_Geometry).time_range,(pIVar5->super_Geometry).fnumTimeSegments);
        auVar20 = ZEXT1664(local_a8);
        aVar2 = this->bounds0[0].bounds0.upper.field_0;
        aVar3 = this->bounds0[0].bounds1.lower.field_0;
        aVar6.m128 = (__m128)vminps_avx(this->bounds0[0].bounds0.lower.field_0,local_98.m128);
        aVar4 = this->bounds0[0].bounds1.upper.field_0;
        this->bounds0[0].bounds0.lower.field_0 = aVar6;
        aVar2.m128 = (__m128)vmaxps_avx(aVar2.m128,local_88);
        this->bounds0[0].bounds0.upper.field_0 = aVar2;
        aVar2.m128 = (__m128)vminps_avx(aVar3.m128,local_78);
        this->bounds0[0].bounds1.lower.field_0 = aVar2;
        aVar2.m128 = (__m128)vmaxps_avx(aVar4.m128,local_68);
        this->bounds0[0].bounds1.upper.field_0 = aVar2;
        auVar10._0_4_ = (float)(uint)pfVar8[-2];
        auVar10._4_12_ = in_register_000013c4;
        BVar1 = *(BBox1f *)(pfVar8 + -1);
        auVar14._8_8_ = 0;
        auVar14._0_4_ = BVar1.lower;
        auVar14._4_4_ = BVar1.upper;
        auVar17 = vmovshdup_avx(auVar14);
        fVar13 = BVar1.lower;
        fVar19 = auVar17._0_4_ - fVar13;
        auVar17 = ZEXT416((uint)(((local_a8._0_4_ - fVar13) / fVar19) * 1.0000002 * auVar10._0_4_));
        auVar17 = vroundss_avx(auVar17,auVar17,9);
        auVar17 = vmaxss_avx(ZEXT816(0) << 0x40,auVar17);
        auVar15 = ZEXT416((uint)((((float)local_b8._0_4_ - fVar13) / fVar19) * 0.99999976 *
                                auVar10._0_4_));
        auVar15 = vroundss_avx(auVar15,auVar15,10);
        auVar15 = vminss_avx(auVar15,auVar10);
        this->count0[0] = this->count0[0] + (long)((int)auVar15._0_4_ - (int)auVar17._0_4_);
        fVar19 = (float)local_b8._0_4_;
      }
      if ((fVar19 < *pfVar8 * 0.9999) &&
         (((BBox1f *)(pfVar8 + -1))->lower * 1.0001 < (float)local_c8._0_4_)) {
        local_d0 = (BBox1f)vmovlps_avx(local_58);
        pIVar5 = (Instance *)(recalculatePrimRef->scene->geometries).items[(uint)pfVar8[-0xe]].ptr;
        Instance::nonlinearBounds
                  ((LBBox3fa *)&local_98.field_1,pIVar5,&local_d0,
                   &(pIVar5->super_Geometry).time_range,(pIVar5->super_Geometry).fnumTimeSegments);
        auVar20 = ZEXT1664(local_a8);
        aVar2 = this->bounds1[0].bounds0.upper.field_0;
        aVar3 = this->bounds1[0].bounds1.lower.field_0;
        aVar6.m128 = (__m128)vminps_avx(this->bounds1[0].bounds0.lower.field_0,local_98.m128);
        aVar4 = this->bounds1[0].bounds1.upper.field_0;
        this->bounds1[0].bounds0.lower.field_0 = aVar6;
        aVar2.m128 = (__m128)vmaxps_avx(aVar2.m128,local_88);
        this->bounds1[0].bounds0.upper.field_0 = aVar2;
        aVar2.m128 = (__m128)vminps_avx(aVar3.m128,local_78);
        this->bounds1[0].bounds1.lower.field_0 = aVar2;
        aVar2.m128 = (__m128)vmaxps_avx(aVar4.m128,local_68);
        this->bounds1[0].bounds1.upper.field_0 = aVar2;
        auVar11._0_4_ = (float)(uint)pfVar8[-2];
        auVar11._4_12_ = in_register_000013c4;
        BVar1 = *(BBox1f *)(pfVar8 + -1);
        auVar16._8_8_ = 0;
        auVar16._0_4_ = BVar1.lower;
        auVar16._4_4_ = BVar1.upper;
        fVar13 = BVar1.lower;
        auVar17 = vmovshdup_avx(auVar16);
        fVar19 = auVar17._0_4_ - fVar13;
        auVar17 = ZEXT416((uint)((((float)local_b8._0_4_ - fVar13) / fVar19) * 1.0000002 *
                                auVar11._0_4_));
        auVar17 = vroundss_avx(auVar17,auVar17,9);
        auVar17 = vmaxss_avx(ZEXT816(0) << 0x20,auVar17);
        auVar15 = ZEXT416((uint)((((float)local_c8._0_4_ - fVar13) / fVar19) * 0.99999976 *
                                auVar11._0_4_));
        auVar15 = vroundss_avx(auVar15,auVar15,10);
        auVar15 = vminss_avx(auVar15,auVar11);
        this->count1[0] = this->count1[0] + (long)((int)auVar15._0_4_ - (int)auVar17._0_4_);
        fVar19 = (float)local_b8._0_4_;
      }
      pfVar8 = pfVar8 + 0x14;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  return;
}

Assistant:

void bin(const PrimRefMB* prims, size_t begin, size_t end, BBox1f time_range, const SetMB& set, const RecalculatePrimRef& recalculatePrimRef)
          {
            for (int b=0; b<BINS-1; b++)
            {
              const float t = float(b+1)/float(BINS);
              const float ct = lerp(time_range.lower,time_range.upper,t);
              const float center_time = set.align_time(ct);
              if (center_time <= time_range.lower) continue;
              if (center_time >= time_range.upper) continue;
              const BBox1f dt0(time_range.lower,center_time);
              const BBox1f dt1(center_time,time_range.upper);
              
              /* find linear bounds for both time segments */
              for (size_t i=begin; i<end; i++) 
              {
                if (prims[i].time_range_overlap(dt0))
                {
                  const LBBox3fa bn0 = recalculatePrimRef.linearBounds(prims[i],dt0);
#if MBLUR_BIN_LBBOX
                  bounds0[b].extend(bn0);
#else
                  bounds0[b].extend(bn0.interpolate(0.5f));
#endif
                  count0[b] += prims[i].timeSegmentRange(dt0).size();
                }

                if (prims[i].time_range_overlap(dt1))
                {
                  const LBBox3fa bn1 = recalculatePrimRef.linearBounds(prims[i],dt1);
#if MBLUR_BIN_LBBOX
                  bounds1[b].extend(bn1);
#else
                  bounds1[b].extend(bn1.interpolate(0.5f));
#endif
                  count1[b] += prims[i].timeSegmentRange(dt1).size();
                }
              }
            }
          }